

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O3

void encoderEngine(Territory ccode,EncodeRec *enc,int stop_with_one_result,int extraDigits,
                  int requiredEncoder,Territory ccode_override)

{
  ushort *puVar1;
  TerritoryBoundary *b;
  long lVar2;
  int firstcode;
  uint uVar3;
  Mapcodes *pMVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  size_t sVar13;
  ulong uVar14;
  uint *puVar15;
  ulong uVar16;
  char *pcVar17;
  char cVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  int GOODROUNDER;
  char (*territoryISO) [29];
  char *result_00;
  byte bVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  byte bVar30;
  uint uVar31;
  long lVar32;
  uint uVar33;
  int iVar34;
  int *piVar35;
  uint uVar36;
  int iVar37;
  long lVar38;
  bool bVar39;
  int local_140;
  int local_128;
  int *local_e8;
  uint *local_e0;
  undefined8 local_c0;
  char result [128];
  
  uVar22 = (ulong)(uint)ccode_override;
  if (999 < ccode && enc != (EncodeRec *)0x0) {
    firstcode = *(int *)("" + (long)ccode * 4 + 0x28c);
    lVar38 = (long)firstcode;
    iVar9 = DATA_START[(uint)(ccode + 0xfffffc18)];
    lVar2 = (long)iVar9 + -1;
    iVar8 = fitsInsideBoundaries(&enc->coord32,TERRITORY_BOUNDARIES + lVar2);
    if ((iVar8 != 0) && (result[0] = '\0', firstcode < iVar9)) {
      if (requiredEncoder == -1) {
        requiredEncoder = ccode;
      }
      local_e0 = (uint *)(&DAT_001c346c + lVar38 * 0x14);
      local_e8 = &TERRITORY_BOUNDARIES[lVar38].flags;
      iVar8 = 0;
      local_c0 = (long)iVar9;
LAB_0016d75c:
      b = TERRITORY_BOUNDARIES + lVar38;
      iVar9 = fitsInsideBoundaries(&enc->coord32,b);
      if (iVar9 == 0) goto LAB_0016dfe4;
      uVar31 = TERRITORY_BOUNDARIES[lVar38].flags;
      bVar30 = (byte)uVar31;
      iVar9 = (int)uVar31 >> 0x10;
      if ((uVar31 & 0x40) != 0) {
        iVar27 = (int)lVar38;
        iVar29 = countNamelessRecords(iVar27,firstcode);
        iVar12 = firstNamelessRecord(iVar27,firstcode);
        iVar27 = iVar27 - iVar12;
        result[0] = '\0';
        bVar30 = (bVar30 & 0x1f) + (char)((uVar31 & 0x1f) * 0x34 >> 8) * -5 +
                 (char)((uVar31 & 0x1f) / 5) * '\n' + 1;
        if ((bVar30 == 0x15) || (0x1f < iVar29)) {
          if ((bVar30 == 0x15) || (0x3d < iVar29)) {
            lVar21 = 0x1b4d89f;
            if (bVar30 == 0x15) {
              lVar21 = 0xe1781;
            }
            iVar12 = (int)(lVar21 / (long)iVar29);
            if (iVar29 == 0x3e) {
              iVar12 = iVar12 + 1;
            }
            else {
              iVar12 = (iVar12 / 0x3c1) * 0x3c1;
            }
            iVar12 = iVar12 * iVar27;
          }
          else if (iVar27 < 0x3e - iVar29) {
            iVar12 = iVar27 * 0xe1781;
          }
          else {
            iVar11 = ((((iVar27 + iVar29) - (iVar27 + iVar29 + -0x3e >> 0x1f)) + -0x3e >> 1) +
                     (0x3e - iVar29)) * 0xe1781;
            iVar12 = iVar11 + 0x745f0;
            if ((iVar27 + iVar29 & 1U) == 0) {
              iVar12 = iVar11;
            }
          }
        }
        else {
          iVar12 = (int)(0x1f % (long)iVar29);
          if (iVar27 < iVar12) {
            iVar12 = iVar27;
          }
          iVar12 = (iVar12 + (int)(0x1f / (long)iVar29) * iVar27) * 0xe1781;
        }
        uVar26 = TERRITORY_BOUNDARIES[lVar38].miny;
        iVar27 = TERRITORY_BOUNDARIES[lVar38].maxy;
        uVar19 = uVar26;
        if ((int)uVar26 < 0) {
          iVar11 = 0x168;
          if (iVar27 < 0) {
            uVar19 = -iVar27;
            goto LAB_0016dcac;
          }
        }
        else {
LAB_0016dcac:
          iVar11 = *(int *)(xDivider4_xdivider19 + (ulong)(uVar19 >> 0x13) * 4);
        }
        iVar25 = (enc->coord32).lonMicroDeg - b->minx;
        iVar28 = (enc->fraclon / 810000 + iVar25 * 4) / iVar11;
        iVar34 = iVar27 - (enc->coord32).latMicroDeg;
        iVar20 = iVar34 / 0x5a;
        iVar34 = iVar34 % 0x5a;
        if (iVar34 == 0) {
          iVar34 = 0;
          if (0 < enc->fraclat) {
            iVar34 = 0x5a;
          }
          iVar20 = iVar20 - (uint)(0 < enc->fraclat);
        }
        if ((uVar31 >> 10 & 1) == 0) {
          iVar20 = iVar20 + iVar28 * iVar9;
        }
        else {
          iVar37 = (int)(iVar27 - uVar26) >> 0x1f;
          iVar24 = -iVar37;
          iVar37 = (int)(iVar27 - uVar26) / 0x5a + iVar37;
          iVar27 = iVar28 / 6;
          iVar10 = (int)((long)(ulong)(uint)(iVar9 * iVar9) / (long)(iVar37 + iVar24 + 1));
          iVar5 = (iVar10 + -4) / 6;
          iVar10 = iVar10 + iVar5 * -6;
          iVar6 = iVar5;
          if (iVar27 < iVar5) {
            iVar6 = iVar27;
          }
          if (iVar27 < iVar5) {
            iVar10 = 6;
          }
          iVar20 = iVar28 + iVar6 * (iVar37 + iVar24) * 6 + iVar10 * iVar20;
        }
        bVar23 = bVar30 + (char)((uint)bVar30 * 0x67 >> 10) * -9;
        uVar16 = (ulong)bVar23;
        result[uVar16 + 1] = '\0';
        uVar22 = uVar16 + 2;
        iVar12 = iVar20 + iVar12;
        do {
          result[uVar22 - 2] = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[iVar12 % 0x1f];
          uVar22 = uVar22 - 1;
          iVar12 = iVar12 / 0x1f;
        } while (1 < uVar22);
        lVar21 = (long)(int)((uint)bVar23 - (uint)(bVar30 == 0xd));
        *(undefined4 *)(result + lVar21) = *(undefined4 *)(result + lVar21 + -1);
        result[lVar21 + -1] = '.';
        if (((((uVar31 >> 10 & 1) == 0) && (iVar9 == 0x3c1)) && (bVar30 == 0x16)) && (iVar29 < 0x3e)
           ) {
          cVar18 = result[uVar16 - 2];
          result[uVar16 - 2] = result[uVar16];
          result[uVar16] = cVar18;
        }
        uVar22 = (ulong)(uint)extraDigits;
        encodeExtension(result,iVar25 * 4 - iVar28 * iVar11,iVar34,iVar11,0x5a,extraDigits,-1,enc);
        goto LAB_0016df07;
      }
      if ((uVar31 >> 8 & 1) != 0) {
        bVar30 = (bVar30 & 0x1f) + (char)((uVar31 & 0x1f) * 0x34 >> 8) * -5 +
                 (char)((uVar31 & 0x1f) / 5) * '\n' + 1;
        puVar15 = local_e0;
        piVar7 = local_e8;
        lVar21 = 0;
        do {
          lVar32 = lVar21;
          piVar35 = piVar7;
          uVar31 = *puVar15;
          if ((uVar31 >> 8 & 1) == 0) break;
          puVar15 = puVar15 + -5;
          piVar7 = piVar35 + -5;
          lVar21 = lVar32 + 1;
        } while ((byte)(((byte)uVar31 & 0x1f) + (char)((uVar31 & 0x1f) * 0x34 >> 8) * -5 +
                        (char)((uVar31 & 0x1f) / 5) * '\n' + 1) == bVar30);
        iVar9 = 0xe1781;
        if (0x16 < bVar30) {
          iVar9 = 0x1b4d89f;
        }
        iVar29 = 0;
        do {
          uVar31 = piVar35[-3];
          uVar26 = piVar35[-1];
          uVar19 = uVar31;
          if ((int)uVar31 < 0) {
            iVar12 = 0x168;
            if ((int)uVar26 < 0) {
              uVar19 = -uVar26;
              goto LAB_0016d96a;
            }
          }
          else {
LAB_0016d96a:
            iVar12 = *(int *)(xDivider4_xdivider19 + (ulong)(uVar19 >> 0x13) * 4);
          }
          iVar34 = uVar26 - uVar31;
          iVar27 = (int)((ulong)((long)(iVar34 + 0x59) * -0x49f49f49) >> 0x20) + iVar34 + 0x59;
          iVar20 = piVar35[-2] - ((TerritoryBoundary *)(piVar35 + -4))->minx;
          iVar27 = (((iVar27 >> 6) - (iVar27 >> 0x1f)) + 0xaf) / 0xb0;
          iVar12 = ((iVar12 + iVar20 * 4 + -1) / iVar12 + 0xa7) / 0xa8;
          iVar11 = iVar27 * iVar12 * 0x745f;
          if ((*piVar35 & 0x180U) == 0x100) {
            iVar11 = iVar11 + iVar29 + iVar9 + -1;
            iVar11 = iVar11 - (iVar11 % iVar9 + iVar29);
          }
          bVar39 = lVar32 == 0;
          lVar32 = lVar32 + -1;
          if (bVar39) goto LAB_0016da4d;
          iVar29 = iVar11 + iVar29;
          piVar35 = piVar35 + 5;
        } while( true );
      }
      if ((((uint)(ccode + ~TERRITORY_AAA) < 0xfffffdeb) || (lVar38 != lVar2)) ||
         ((long)""[(uint)(ccode + ~_TERRITORY_MIN)] == 0)) {
        if (((iVar8 == 0) && ((uVar31 & 0x200) != 0)) ||
           (bVar23 = (bVar30 & 0x1f) + (char)((uVar31 & 0x1f) * 0x34 >> 8) * -5 +
                     (char)((uVar31 & 0x1f) / 5) * '\n' + 1, 0x35 < bVar23)) goto LAB_0016df07;
        if ((char)bVar30 < '\0') {
          cVar18 = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[uVar31 >> 0xb & 0x1f];
        }
        else {
          cVar18 = '\0';
        }
        uVar31 = (uint)bVar23;
        if (bVar23 == 0xe) {
          uVar31 = 0x17;
        }
        if (bVar23 == 0x15) {
          uVar31 = 0x16;
        }
        bVar30 = (byte)uVar31;
        result[0] = '\0';
        uVar26 = uVar31 / 10;
        uVar22 = (ulong)uVar26;
        if (iVar9 == 1) {
          iVar29 = *(int *)((long)X_SIDE + (ulong)(uVar26 * 4));
          iVar9 = *(int *)((long)Y_SIDE + (ulong)(uVar26 * 4));
        }
        else {
          iVar29 = NC[uVar22] / iVar9;
        }
        uVar19 = b->minx;
        uVar3 = TERRITORY_BOUNDARIES[lVar38].miny;
        local_140 = (int)(~uVar3 + TERRITORY_BOUNDARIES[lVar38].maxy + iVar9) / iVar9;
        local_128 = (int)(~uVar19 + TERRITORY_BOUNDARIES[lVar38].maxx + iVar29) / iVar29;
        iVar12 = (enc->coord32).latMicroDeg;
        iVar27 = (enc->coord32).lonMicroDeg;
        uVar36 = iVar27 - uVar19;
        if ((int)uVar36 < 0) {
          iVar11 = 360000000;
LAB_0016e0f1:
          uVar36 = uVar36 + iVar11;
          iVar27 = iVar27 + iVar11;
        }
        else if (359999999 < uVar36) {
          iVar11 = -360000000;
          goto LAB_0016e0f1;
        }
        uVar33 = (int)(iVar12 - uVar3) / local_140;
        iVar11 = (int)uVar36 / local_128;
        if ((iVar29 <= iVar11) || (iVar9 <= (int)uVar33)) goto LAB_0016df07;
        uVar16 = (ulong)(cVar18 != '\0');
        result_00 = result + uVar16;
        if ((bVar30 < 0x1e) || (iVar29 == iVar9)) {
          result_00[uVar22] = '\0';
          if (9 < bVar30) {
            iVar20 = ~uVar33 + iVar9 + iVar11 * iVar9;
            goto LAB_0016e1eb;
          }
        }
        else {
          iVar20 = iVar11 / 6;
          iVar34 = (iVar29 + -4) / 6;
          iVar25 = iVar34;
          if (iVar20 < iVar34) {
            iVar25 = iVar20;
          }
          iVar28 = iVar29 + iVar34 * -6;
          if (iVar20 < iVar34) {
            iVar28 = 6;
          }
          iVar20 = (iVar9 * 6 + -6) * iVar25 + iVar11 + (~uVar33 + iVar9) * iVar28;
          result_00[uVar22] = '\0';
LAB_0016e1eb:
          uVar14 = uVar22 + 1;
          do {
            result[uVar14 + uVar16 + -2] = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[iVar20 % 0x1f];
            uVar14 = uVar14 - 1;
            iVar20 = iVar20 / 0x1f;
          } while (1 < uVar14);
        }
        pcVar17 = result_00 + uVar22;
        if (((iVar9 == 0x3c1) && (uVar31 - 0x28 < 10)) && (iVar29 == 0x3c1)) {
          puVar1 = (ushort *)(result + uVar16 + 1);
          *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        }
        bVar30 = bVar30 + (char)uVar26 * -10;
        iVar9 = *(int *)((long)Y_SIDE + (ulong)((uint)bVar30 * 4));
        iVar34 = (local_140 + iVar9 + -1) / iVar9;
        iVar29 = *(int *)((long)X_SIDE + (ulong)((uint)bVar30 * 4));
        iVar29 = (local_128 + iVar29 + -1) / iVar29;
        iVar27 = iVar27 - (uVar19 + iVar11 * local_128);
        *pcVar17 = '.';
        iVar20 = iVar27 / iVar29;
        iVar12 = iVar12 - (uVar3 + uVar33 * local_140);
        iVar11 = ~(iVar12 / iVar34) + iVar9;
        if (bVar30 == 3) {
          encodeTriple(pcVar17 + 1,iVar20,iVar11);
        }
        else {
          (pcVar17 + 1)[bVar30] = '\0';
          if (bVar30 != 0) {
            uVar22 = (ulong)uVar31 + (ulong)(uVar26 * 2) * -5 + 1;
            iVar9 = iVar11 + iVar20 * iVar9;
            do {
              pcVar17[uVar22 - 1] = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[iVar9 % 0x1f];
              uVar22 = uVar22 - 1;
              iVar9 = iVar9 / 0x1f;
            } while (1 < uVar22);
            if (bVar30 == 4) {
              puVar1 = (ushort *)(pcVar17 + 2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            }
          }
        }
        if (bVar23 == 0xe) {
          result[uVar16 + 2] = result[uVar16 + 1];
          result[uVar16 + 1] = '.';
        }
        uVar22 = (ulong)(uint)extraDigits;
        encodeExtension(result_00,iVar27 % iVar29 << 2,iVar12 % iVar34,iVar29 << 2,iVar34,
                        extraDigits,1,enc);
        if (cVar18 == '\0') goto LAB_0016df07;
        goto LAB_0016df11;
      }
      encoderEngine(PARENT_NR[""[(uint)(ccode + ~_TERRITORY_MIN)]],enc,stop_with_one_result,
                    extraDigits,ccode,(Territory)uVar22);
    }
  }
  return;
LAB_0016da4d:
  iVar34 = (iVar34 + iVar27 * 0xb0 + -1) / (iVar27 * 0xb0);
  iVar9 = uVar26 - (enc->coord32).latMicroDeg;
  iVar11 = iVar9 / iVar34;
  iVar9 = iVar9 % iVar34;
  if (iVar9 == 0) {
    iVar9 = 0;
    if (0 < enc->fraclat) {
      iVar9 = iVar34;
    }
    iVar11 = iVar11 - (uint)(0 < enc->fraclat);
  }
  iVar25 = (enc->coord32).lonMicroDeg - ((TerritoryBoundary *)(piVar35 + -4))->minx;
  iVar12 = iVar12 * 0xa8;
  iVar12 = (iVar20 + iVar12 + -1) / iVar12;
  iVar20 = iVar25 / iVar12;
  uVar31 = (uint)bVar30 + (bVar30 / 10) * -10 + bVar30 / 10;
  uVar22 = (ulong)uVar31;
  if (2 < uVar31) {
    uVar16 = (uVar22 - 2 & 0xffffffff) + 1;
    iVar29 = iVar11 / 0xb0 + iVar29 / 0x745f + (iVar20 / 0xa8) * iVar27;
    do {
      result[uVar16 - 2] = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[iVar29 % 0x1f];
      uVar16 = uVar16 - 1;
      iVar29 = iVar29 / 0x1f;
    } while (1 < uVar16);
  }
  result[uVar22 - 2] = '.';
  encodeTriple(result + (uVar22 - 1),iVar20 % 0xa8,iVar11 % 0xb0);
  uVar22 = (ulong)(uint)extraDigits;
  encodeExtension(result,iVar25 % iVar12 << 2,iVar9,iVar12 << 2,iVar34,extraDigits,-1,enc);
LAB_0016df07:
  cVar18 = result[0];
  if (result[0] != '\0') {
LAB_0016df11:
    result[0] = cVar18;
    repackIfAllDigits(result,0);
    if ((result[0] != '\0') && (pMVar4 = enc->mapcodes, pMVar4 != (Mapcodes *)0x0)) {
      iVar9 = pMVar4->count;
      if ((long)iVar9 < 0x16) {
        pMVar4->count = iVar9 + 1;
        territoryISO = pMVar4->mapcode + iVar9;
        if (requiredEncoder == TERRITORY_AAA) {
          strcpy(*territoryISO,result);
        }
        else {
          getTerritoryIsoName(*territoryISO,requiredEncoder,0);
          sVar13 = strlen(*territoryISO);
          (*territoryISO + sVar13)[0] = ' ';
          (*territoryISO + sVar13)[1] = '\0';
          strcat(*territoryISO,result);
        }
      }
    }
    if (stop_with_one_result != 0) {
      return;
    }
    if (lVar38 == -1) {
      return;
    }
    iVar8 = iVar8 + 1;
    result[0] = '\0';
  }
LAB_0016dfe4:
  lVar38 = lVar38 + 1;
  local_e0 = local_e0 + 5;
  local_e8 = local_e8 + 5;
  if ((int)local_c0 == (int)lVar38) {
    return;
  }
  goto LAB_0016d75c;
}

Assistant:

static void encoderEngine(const enum Territory ccode, const EncodeRec *enc, const int stop_with_one_result,
                          const int extraDigits, const int requiredEncoder, const enum Territory ccode_override) {
    int from;
    int upto;
    ASSERT(enc);
    ASSERT((0 <= extraDigits) && (extraDigits <= MAX_PRECISION_DIGITS));

    if (!enc || (ccode < _TERRITORY_MIN)) {
        return;
    } // bad arguments

    from = firstRec(ccode);
    upto = lastRec(ccode);

    if (!fitsInsideBoundaries(&enc->coord32, TERRITORY_BOUNDARY(upto))) {
        return;
    }

    ///////////////////////////////////////////////////////////
    // look for encoding options
    ///////////////////////////////////////////////////////////
    {
        int i;
        char result[128];
        int result_counter = 0;

        *result = 0;
        for (i = from; i <= upto; i++) {
            if (fitsInsideBoundaries(&enc->coord32, TERRITORY_BOUNDARY(i))) {
                if (IS_NAMELESS(i)) {
                    encodeNameless(result, enc, ccode, extraDigits, i);
                } else if (REC_TYPE(i) > 1) {
                    encodeAutoHeader(result, enc, i, extraDigits);
                } else if ((i == upto) && isSubdivision(ccode)) {
                    // *** do a recursive call for the parent ***
                    encoderEngine(parentTerritoryOf(ccode), enc, stop_with_one_result, extraDigits, requiredEncoder,
                                  ccode);
                    return;
                } else // must be grid
                {
                    // skip IS_RESTRICTED records unless there already is a result
                    if (result_counter || !IS_RESTRICTED(i)) {
                        if (coDex(i) < 54) {
                            char headerletter = (char) ((REC_TYPE(i) == 1) ? HEADER_LETTER(i) : 0);
                            encodeGrid(result, enc, i, extraDigits, headerletter);
                        }
                    }
                }

                // =========== handle result (if any)
                if (*result) {
                    result_counter++;

                    repackIfAllDigits(result, 0);

                    if ((requiredEncoder < 0) || (requiredEncoder == i)) {
                        const enum Territory ccodeFinal = (ccode_override != TERRITORY_NONE ? ccode_override : ccode);
                        if (*result && enc->mapcodes && (enc->mapcodes->count < MAX_NR_OF_MAPCODE_RESULTS)) {
                            char *s = enc->mapcodes->mapcode[enc->mapcodes->count++];
                            if (ccodeFinal == TERRITORY_AAA) { // AAA is never shown with territory
                                strcpy(s, result);
                            } else {
                                getTerritoryIsoName(s, ccodeFinal, 0);
                                strcat(s, " ");
                                strcat(s, result);
                            }
                        }
                        if (requiredEncoder == i) {
                            return;
                        }
                    }
                    if (stop_with_one_result) {
                        return;
                    }
                    *result = 0; // clear for next iteration
                }
            }
        } // for i
    }
}